

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fb.h
# Opt level: O2

size_t fb_ffs(fb_group_t *fb,size_t nbits,size_t min_bit)

{
  long lVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  
  uVar2 = nbits >> 6;
  uVar4 = (fb[uVar2] >> ((byte)nbits & 0x3f)) << ((byte)nbits & 0x3f);
  lVar3 = -(nbits & 0xffffffffffffffc0);
  while( true ) {
    if (uVar4 != 0) {
      lVar1 = 0;
      if (uVar4 != 0) {
        for (; (uVar4 >> lVar1 & 1) == 0; lVar1 = lVar1 + 1) {
        }
      }
      return lVar1 - lVar3;
    }
    if (uVar2 == 7) break;
    uVar4 = fb[uVar2 + 1];
    lVar3 = lVar3 + -0x40;
    uVar2 = uVar2 + 1;
  }
  return 0x200;
}

Assistant:

static inline size_t
fb_ffs(fb_group_t *fb, size_t nbits, size_t min_bit) {
	return (size_t)fb_find_impl(fb, nbits, min_bit, /* val */ true,
	    /* forward */ true);
}